

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  char *local_30 [2];
  char local_20 [16];
  
  if (placement == commentAfterOnSameLine) {
    this_00 = this->lastValue_;
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30);
    Value::setComment(this_00,local_30[0],commentAfterOnSameLine);
  }
  else {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30);
    std::__cxx11::string::_M_append((char *)&this->commentsBefore_,(ulong)local_30[0]);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(std::string(begin, end), placement);
  } else {
    commentsBefore_ += std::string(begin, end);
  }
}